

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

void array_random_bang(t_array_random *x)

{
  int iVar1;
  int local_24;
  int local_20;
  int arrayonset;
  int nitem;
  int stride;
  char *firstitem;
  t_array_random *x_local;
  
  firstitem = (char *)x;
  iVar1 = array_rangeop_getrange(&x->x_r,(char **)&nitem,&local_20,&arrayonset,&local_24);
  if (iVar1 != 0) {
    *(int *)(firstitem + 0x80) = *(int *)(firstitem + 0x80) * 0x1c307df1 + 0x319da917;
    array_quantile_float
              ((t_array_rangeop *)firstitem,
               (float)((double)*(uint *)(firstitem + 0x80) * 2.3283064365386963e-10));
  }
  return;
}

Assistant:

static void array_random_bang(t_array_random *x)
{
    char *firstitem;
    int stride, nitem, arrayonset;

    if (!array_rangeop_getrange(&x->x_r, &firstitem, &nitem, &stride,
        &arrayonset))
            return;
    x->x_state = x->x_state * 472940017 + 832416023;
    array_quantile_float(&x->x_r, (1./4294967296.0) * (double)(x->x_state));
}